

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O1

void __thiscall i2p::sam::Session::CheckControlSock(Session *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  Sock *pSVar3;
  bool bVar4;
  int iVar5;
  Logger *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock11;
  string errmsg;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock11.super_unique_lock._M_device = &(this->m_mutex).super_mutex;
  criticalblock11.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock11.super_unique_lock);
  paVar1 = &errmsg.field_2;
  errmsg._M_string_length = 0;
  errmsg.field_2._M_local_buf[0] = '\0';
  pSVar3 = (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
           super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  errmsg._M_dataplus._M_p = (pointer)paVar1;
  if (pSVar3 != (Sock *)0x0) {
    iVar5 = (*pSVar3->_vptr_Sock[0x13])(pSVar3,&errmsg);
    if ((char)iVar5 == '\0') {
      this_00 = LogInstance();
      bVar4 = BCLog::Logger::WillLogCategoryLevel(this_00,I2P,Debug);
      if (bVar4) {
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp";
        source_file._M_len = 0x50;
        logging_function._M_str = "CheckControlSock";
        logging_function._M_len = 0x10;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function,source_file,0x15b,NET,0xfbd76b,(char *)&errmsg,
                   in_stack_ffffffffffffffa8);
      }
      Disconnect(this);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)errmsg._M_dataplus._M_p != paVar1) {
    operator_delete(errmsg._M_dataplus._M_p,
                    CONCAT71(errmsg.field_2._M_allocated_capacity._1_7_,
                             errmsg.field_2._M_local_buf[0]) + 1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock11.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Session::CheckControlSock()
{
    LOCK(m_mutex);

    std::string errmsg;
    if (m_control_sock && !m_control_sock->IsConnected(errmsg)) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Control socket error: %s\n", errmsg);
        Disconnect();
    }
}